

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall re2::Regexp::ParseState::ParsePerlFlags(ParseState *this,StringPiece *s)

{
  RegexpStatus *this_00;
  undefined8 this_01;
  char cVar1;
  bool bVar2;
  ParseFlags PVar3;
  int iVar4;
  ostream *poVar5;
  size_type sVar6;
  iterator pcVar7;
  iterator pcVar8;
  iterator pcVar9;
  StringPiece local_208;
  byte local_1f5;
  int local_1f4;
  ParseFlags PStack_1f0;
  bool done;
  Rune c;
  int nflags;
  bool sawflags;
  bool negated;
  StringPiece name;
  StringPiece capture;
  size_t end;
  LogMessage local_1b0;
  undefined1 local_30 [8];
  StringPiece t;
  StringPiece *s_local;
  ParseState *this_local;
  
  local_30 = (undefined1  [8])s->ptr_;
  t.ptr_ = *(char **)&s->length_;
  t._8_8_ = s;
  PVar3 = operator&(this->flags_,PerlX);
  if ((((PVar3 == NoParseFlags) || (iVar4 = StringPiece::size((StringPiece *)local_30), iVar4 < 2))
      || (cVar1 = StringPiece::operator[]((StringPiece *)local_30,0), cVar1 != '(')) ||
     (cVar1 = StringPiece::operator[]((StringPiece *)local_30,1), cVar1 != '?')) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/parse.cc",0x776
              );
    poVar5 = LogMessage::stream(&local_1b0);
    std::operator<<(poVar5,"Bad call to ParseState::ParsePerlFlags");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    RegexpStatus::set_code(this->status_,kRegexpInternalError);
    this_local._7_1_ = false;
  }
  else {
    StringPiece::remove_prefix((StringPiece *)local_30,2);
    iVar4 = StringPiece::size((StringPiece *)local_30);
    if (((iVar4 < 3) || (cVar1 = StringPiece::operator[]((StringPiece *)local_30,0), cVar1 != 'P'))
       || (cVar1 = StringPiece::operator[]((StringPiece *)local_30,1), cVar1 != '<')) {
      c._3_1_ = 0;
      c._2_1_ = 0;
      PStack_1f0 = this->flags_;
      local_1f5 = 0;
      while (((local_1f5 ^ 0xff) & 1) != 0) {
        iVar4 = StringPiece::size((StringPiece *)local_30);
        if (iVar4 == 0) goto LAB_00179a5f;
        iVar4 = StringPieceToRune(&local_1f4,(StringPiece *)local_30,this->status_);
        if (iVar4 < 0) {
          return false;
        }
        if (local_1f4 == 0x29) {
          local_1f5 = 1;
        }
        else if (local_1f4 == 0x2d) {
          if ((c._3_1_ & 1) != 0) goto LAB_00179a5f;
          c._3_1_ = 1;
          c._2_1_ = 0;
        }
        else if (local_1f4 == 0x3a) {
          bVar2 = DoLeftParenNoCapture(this);
          if (!bVar2) {
            return false;
          }
          local_1f5 = 1;
        }
        else if (local_1f4 == 0x55) {
          c._2_1_ = 1;
          if ((c._3_1_ & 1) == 0) {
            PStack_1f0 = PStack_1f0 | NonGreedy;
          }
          else {
            PVar3 = operator~(NonGreedy);
            PStack_1f0 = PVar3 & PStack_1f0;
          }
        }
        else if (local_1f4 == 0x69) {
          c._2_1_ = 1;
          if ((c._3_1_ & 1) == 0) {
            PStack_1f0 = PStack_1f0 | FoldCase;
          }
          else {
            PVar3 = operator~(FoldCase);
            PStack_1f0 = PVar3 & PStack_1f0;
          }
        }
        else if (local_1f4 == 0x6d) {
          c._2_1_ = 1;
          if ((c._3_1_ & 1) == 0) {
            PVar3 = operator~(OneLine);
            PStack_1f0 = PVar3 & PStack_1f0;
          }
          else {
            PStack_1f0 = PStack_1f0 | OneLine;
          }
        }
        else {
          if (local_1f4 != 0x73) goto LAB_00179a5f;
          c._2_1_ = 1;
          if ((c._3_1_ & 1) == 0) {
            PStack_1f0 = PStack_1f0 | DotNL;
          }
          else {
            PVar3 = operator~(DotNL);
            PStack_1f0 = PVar3 & PStack_1f0;
          }
        }
      }
      if (((c._3_1_ & 1) == 0) || ((c._2_1_ & 1) != 0)) {
        this->flags_ = PStack_1f0;
        *(undefined1 (*) [8])t._8_8_ = local_30;
        *(undefined4 *)(t._8_8_ + 8) = t.ptr_._0_4_;
        this_local._7_1_ = true;
      }
      else {
LAB_00179a5f:
        RegexpStatus::set_code(this->status_,kRegexpBadPerlOp);
        this_00 = this->status_;
        pcVar7 = StringPiece::begin((StringPiece *)t._8_8_);
        pcVar8 = StringPiece::begin((StringPiece *)local_30);
        pcVar9 = StringPiece::begin((StringPiece *)t._8_8_);
        StringPiece::StringPiece(&local_208,pcVar7,(int)pcVar8 - (int)pcVar9);
        RegexpStatus::set_error_arg(this_00,&local_208);
        this_local._7_1_ = false;
      }
    }
    else {
      sVar6 = StringPiece::find((StringPiece *)local_30,'>',2);
      if (sVar6 == 0xffffffffffffffff) {
        bVar2 = IsValidUTF8((StringPiece *)t._8_8_,this->status_);
        if (bVar2) {
          RegexpStatus::set_code(this->status_,kRegexpBadNamedCapture);
          RegexpStatus::set_error_arg(this->status_,(StringPiece *)t._8_8_);
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        pcVar7 = StringPiece::begin((StringPiece *)local_30);
        StringPiece::StringPiece((StringPiece *)&name.length_,pcVar7 + -2,(int)sVar6 + 3);
        pcVar7 = StringPiece::begin((StringPiece *)local_30);
        StringPiece::StringPiece((StringPiece *)&nflags,pcVar7 + 2,(int)sVar6 + -2);
        bVar2 = IsValidUTF8((StringPiece *)&nflags,this->status_);
        if (bVar2) {
          bVar2 = IsValidCaptureName((StringPiece *)&nflags);
          if (bVar2) {
            bVar2 = DoLeftParen(this,(StringPiece *)&nflags);
            this_01 = t._8_8_;
            if (bVar2) {
              pcVar7 = StringPiece::end((StringPiece *)&name.length_);
              pcVar8 = StringPiece::begin((StringPiece *)t._8_8_);
              StringPiece::remove_prefix((StringPiece *)this_01,(int)pcVar7 - (int)pcVar8);
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            RegexpStatus::set_code(this->status_,kRegexpBadNamedCapture);
            RegexpStatus::set_error_arg(this->status_,(StringPiece *)&name.length_);
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Regexp::ParseState::ParsePerlFlags(StringPiece* s) {
  StringPiece t = *s;

  // Caller is supposed to check this.
  if (!(flags_ & PerlX) || t.size() < 2 || t[0] != '(' || t[1] != '?') {
    LOG(DFATAL) << "Bad call to ParseState::ParsePerlFlags";
    status_->set_code(kRegexpInternalError);
    return false;
  }

  t.remove_prefix(2);  // "(?"

  // Check for named captures, first introduced in Python's regexp library.
  // As usual, there are three slightly different syntaxes:
  //
  //   (?P<name>expr)   the original, introduced by Python
  //   (?<name>expr)    the .NET alteration, adopted by Perl 5.10
  //   (?'name'expr)    another .NET alteration, adopted by Perl 5.10
  //
  // Perl 5.10 gave in and implemented the Python version too,
  // but they claim that the last two are the preferred forms.
  // PCRE and languages based on it (specifically, PHP and Ruby)
  // support all three as well.  EcmaScript 4 uses only the Python form.
  //
  // In both the open source world (via Code Search) and the
  // Google source tree, (?P<expr>name) is the dominant form,
  // so that's the one we implement.  One is enough.
  if (t.size() > 2 && t[0] == 'P' && t[1] == '<') {
    // Pull out name.
    size_t end = t.find('>', 2);
    if (end == t.npos) {
      if (!IsValidUTF8(*s, status_))
        return false;
      status_->set_code(kRegexpBadNamedCapture);
      status_->set_error_arg(*s);
      return false;
    }

    // t is "P<name>...", t[end] == '>'
    StringPiece capture(t.begin()-2, static_cast<int>(end)+3);  // "(?P<name>"
    StringPiece name(t.begin()+2, static_cast<int>(end)-2);     // "name"
    if (!IsValidUTF8(name, status_))
      return false;
    if (!IsValidCaptureName(name)) {
      status_->set_code(kRegexpBadNamedCapture);
      status_->set_error_arg(capture);
      return false;
    }

    if (!DoLeftParen(name)) {
      // DoLeftParen's failure set status_.
      return false;
    }

    s->remove_prefix(static_cast<int>(capture.end() - s->begin()));
    return true;
  }

  bool negated = false;
  bool sawflags = false;
  int nflags = flags_;
  Rune c;
  for (bool done = false; !done; ) {
    if (t.size() == 0)
      goto BadPerlOp;
    if (StringPieceToRune(&c, &t, status_) < 0)
      return false;
    switch (c) {
      default:
        goto BadPerlOp;

      // Parse flags.
      case 'i':
        sawflags = true;
        if (negated)
          nflags &= ~FoldCase;
        else
          nflags |= FoldCase;
        break;

      case 'm':  // opposite of our OneLine
        sawflags = true;
        if (negated)
          nflags |= OneLine;
        else
          nflags &= ~OneLine;
        break;

      case 's':
        sawflags = true;
        if (negated)
          nflags &= ~DotNL;
        else
          nflags |= DotNL;
        break;

      case 'U':
        sawflags = true;
        if (negated)
          nflags &= ~NonGreedy;
        else
          nflags |= NonGreedy;
        break;

      // Negation
      case '-':
        if (negated)
          goto BadPerlOp;
        negated = true;
        sawflags = false;
        break;

      // Open new group.
      case ':':
        if (!DoLeftParenNoCapture()) {
          // DoLeftParenNoCapture's failure set status_.
          return false;
        }
        done = true;
        break;

      // Finish flags.
      case ')':
        done = true;
        break;
    }
  }

  if (negated && !sawflags)
    goto BadPerlOp;

  flags_ = static_cast<Regexp::ParseFlags>(nflags);
  *s = t;
  return true;

BadPerlOp:
  status_->set_code(kRegexpBadPerlOp);
  status_->set_error_arg(
      StringPiece(s->begin(), static_cast<int>(t.begin() - s->begin())));
  return false;
}